

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

int czh::utils::get_string_edit_distance(string *s1,string *s2)

{
  ulong __n;
  ulong __n_00;
  pointer pcVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer piVar4;
  int i;
  ulong uVar5;
  int j;
  pointer pvVar6;
  int iVar7;
  int iVar8;
  int j_1;
  ulong uVar9;
  int iVar10;
  allocator_type local_82;
  allocator_type local_81;
  size_type local_80;
  size_type local_78;
  string *local_70;
  string *local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  D;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_80 = s1->_M_string_length;
  local_78 = s2->_M_string_length;
  if (local_78 * local_80 == 0) {
    iVar7 = (int)local_78 + (int)local_80;
  }
  else {
    __n = local_80 + 1;
    __n_00 = local_78 + 1;
    local_70 = s1;
    local_68 = s2;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_48,__n_00,&local_81);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&D,__n,(value_type *)&local_48,&local_82);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    pvVar6 = D.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar5 = 0; __n != uVar5; uVar5 = uVar5 + 1) {
      *(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start = (int)uVar5;
      pvVar6 = pvVar6 + 1;
    }
    for (uVar5 = 0; __n_00 != uVar5; uVar5 = uVar5 + 1) {
      ((D.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->super__Vector_base<int,_std::allocator<int>_>).
      _M_impl.super__Vector_impl_data._M_start[uVar5] = (int)uVar5;
    }
    for (uVar5 = 1; uVar5 < __n; uVar5 = uVar5 + 1) {
      pcVar1 = (local_70->_M_dataplus)._M_p;
      pcVar2 = (local_68->_M_dataplus)._M_p;
      for (uVar9 = 1; uVar9 < __n_00; uVar9 = uVar9 + 1) {
        piVar3 = D.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5 - 1].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        iVar8 = piVar3[uVar9] + 1;
        piVar4 = D.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        iVar7 = piVar4[uVar9 - 1];
        iVar10 = (uint)(pcVar1[uVar5 - 1] != pcVar2[uVar9 - 1]) + piVar3[uVar9 - 1];
        if (iVar7 < iVar10) {
          iVar10 = iVar7 + 1;
        }
        if (iVar8 <= iVar10) {
          iVar10 = iVar8;
        }
        piVar4[uVar9] = iVar10;
      }
    }
    iVar7 = D.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[local_80].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [local_78];
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&D);
  }
  return iVar7;
}

Assistant:

int get_string_edit_distance(const std::string &s1, const std::string &s2)
  {
    std::size_t n = s1.size();
    std::size_t m = s2.size();
    if (n * m == 0) return static_cast<int>(n + m);
    std::vector<std::vector<int>> D(n + 1, std::vector<int>(m + 1));
    for (int i = 0; i < n + 1; i++)
    {
      D[i][0] = i;
    }
    for (int j = 0; j < m + 1; j++)
      D[0][j] = j;
    
    for (int i = 1; i < n + 1; i++)
    {
      for (int j = 1; j < m + 1; j++)
      {
        int left = D[i - 1][j] + 1;
        int down = D[i][j - 1] + 1;
        int left_down = D[i - 1][j - 1];
        if (s1[i - 1] != s2[j - 1]) left_down += 1;
        D[i][j] = (std::min)(left, (std::min)(down, left_down));
      }
    }
    return D[n][m];
  }